

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

int __thiscall
soplex::SPxBoundFlippingRT<double>::selectLeave
          (SPxBoundFlippingRT<double> *this,double *val,double enterTest,bool polish)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  double *pdVar4;
  int *idx;
  double *upp;
  double *low;
  pointer pBVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  LPRowSetBase<double> *pLVar7;
  LPRowSetBase<double> *pLVar8;
  BreakpointSource BVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  ulong uVar14;
  uint uVar15;
  Breakpoint *keys;
  pointer pBVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double dVar27;
  undefined8 uVar28;
  double dVar29;
  int nBp;
  int leaveIdx;
  SPxId baseId;
  int minIdx;
  double local_c0;
  double *local_b8;
  double *local_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined8 uStack_90;
  double *local_80;
  double *local_78;
  BreakpointCompare local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  Breakpoint tmp;
  ulong uVar22;
  
  pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  if ((pSVar2->enterCount * -0x3d70a3d7 + 0x51eb850U >> 2 | pSVar2->enterCount * 0x40000000) <
      0x28f5c29) {
    this->flipPotential = 1.0;
  }
  if ((((polish) || ((this->super_SPxFastRT<double>).field_0x51 != '\x01')) ||
      ((this->super_SPxFastRT<double>).field_0x52 != '\x01')) ||
     ((pSVar2->theRep == COLUMN || (this->flipPotential <= 0.0)))) {
    iVar19 = SPxFastRT<double>::selectLeave(&this->super_SPxFastRT<double>,val,enterTest,polish);
    return iVar19;
  }
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = enterTest;
  local_68._12_4_ = in_XMM0_Dd;
  pUVar3 = pSVar2->theFvec;
  pdVar13 = (pUVar3->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  pdVar4 = (pUVar3->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  idx = (pUVar3->thedelta).super_IdxSet.idx;
  iVar19 = (pUVar3->thedelta).super_IdxSet.num;
  upp = (pSVar2->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  low = (pSVar2->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  leaveIdx = -1;
  local_c0 = *val;
  *val = 0.0;
  nBp = 0;
  minIdx = -1;
  if (local_c0 <= 0.0) {
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar19,pdVar4,pdVar13,upp,low,FVEC);
  }
  else {
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar19,pdVar4,pdVar13,upp,low,FVEC);
  }
  uVar14 = (ulong)(uint)nBp;
  if (nBp == 0) {
    *val = local_c0;
    return -1;
  }
  pBVar5 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar16 = pBVar5 + minIdx;
  tmp.val = pBVar16->val;
  tmp.idx = pBVar16->idx;
  tmp.src = pBVar16->src;
  iVar19 = pBVar5->idx;
  BVar9 = pBVar5->src;
  pBVar16 = pBVar5 + minIdx;
  pBVar16->val = pBVar5->val;
  pBVar16->idx = iVar19;
  pBVar16->src = BVar9;
  pBVar16 = (this->breakpoints).data.
            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar16->val = tmp.val;
  pBVar16->idx = tmp.idx;
  pBVar16->src = tmp.src;
  dVar27 = 0.0;
  dVar29 = local_68._0_8_;
  if ((dVar29 != 0.0) || (NAN(dVar29))) {
    uVar23 = SUB84(ABS(dVar29),0);
    uVar24 = (undefined4)((ulong)ABS(dVar29) >> 0x20);
    uVar22 = local_68._8_8_ & 0x7fffffffffffffff;
    uVar25 = (undefined4)uVar22;
    uVar26 = (undefined4)(uVar22 >> 0x20);
  }
  else {
    dVar29 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
             instableEnterVal;
    uVar23 = SUB84(dVar29,0);
    uVar24 = (undefined4)((ulong)dVar29 >> 0x20);
    uVar25 = 0;
    uVar26 = 0;
  }
  dVar29 = (double)CONCAT44(uVar24,uVar23);
  local_70.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  iVar19 = 0;
  bVar10 = 0 < nBp;
  local_b8 = pdVar13;
  local_b0 = pdVar4;
  local_80 = low;
  local_78 = upp;
  if ((nBp < 1) || ((double)CONCAT44(uVar24,uVar23) < 0.0 || (double)CONCAT44(uVar24,uVar23) == 0.0)
     ) {
    iVar11 = 0;
    uVar28 = 0;
  }
  else {
    iVar11 = 0;
    lVar17 = 8;
    iVar19 = 0;
    dVar27 = 0.0;
    do {
      local_a8._8_4_ = uVar25;
      local_a8._0_8_ = dVar29;
      local_a8._12_4_ = uVar26;
      keys = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
      local_58 = dVar27;
      if (iVar11 < iVar19) {
        iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                           (keys,&local_70,iVar11 + 1,(int)uVar14,4,0,0,true);
        keys = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar12 = *(int *)((long)&keys->val + lVar17);
      local_98 = ABS(local_b0[iVar12]);
      uStack_90 = 0;
      pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      baseId.super_DataKey =
           (pSVar2->super_SPxBasisBase<double>).theBaseId.data[iVar12].super_DataKey;
      pLVar7 = (LPRowSetBase<double> *)&(pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>
      ;
      if (baseId.super_DataKey.info < 1) {
        pLVar7 = &(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>;
      }
      iVar12 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                         (&(pLVar7->super_SVSetBase<double>).set,&baseId.super_DataKey);
      pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      pLVar7 = &(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>;
      if (0 < baseId.super_DataKey.info) {
        pLVar7 = (LPRowSetBase<double> *)
                 &(pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>;
      }
      pLVar8 = (LPRowSetBase<double> *)&(pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>
      ;
      if (baseId.super_DataKey.info < 1) {
        pLVar8 = &(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>;
      }
      uVar25 = local_a8._8_4_;
      uVar26 = local_a8._12_4_;
      dVar29 = local_a8._0_8_ -
               ((pLVar7->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar12] * local_98 -
               (pLVar8->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar12] * local_98);
      dVar27 = local_98;
      if (local_98 <= local_58) {
        dVar27 = local_58;
      }
      iVar19 = iVar19 + 1;
      uVar14 = (ulong)(uint)nBp;
      bVar10 = iVar19 < nBp;
      uVar28 = uStack_90;
    } while ((iVar19 < nBp) && (lVar17 = lVar17 + 0x10, 0.0 < dVar29));
  }
  baseId.super_DataKey.info = iVar19 + -1;
  if ((!bVar10) &&
     (pdVar13 = &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta,
     *pdVar13 <= dVar29 && dVar29 != *pdVar13)) {
    this->flipPotential = this->flipPotential + -0.5;
    *val = local_c0;
    iVar19 = SPxFastRT<double>::selectLeave
                       (&this->super_SPxFastRT<double>,val,
                        (double)CONCAT44(local_68._4_4_,local_68._0_4_),false);
    return iVar19;
  }
  uVar22 = 0xffffffff;
  uVar21 = 0xffffffff;
  if (iVar19 < (int)uVar14) {
    pBVar16 = (this->breakpoints).data.
              super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar29 = pBVar16[iVar19 + -1].val;
    uVar18 = (ulong)iVar19;
    uVar20 = uVar18 << 4 | 8;
    local_a8._0_8_ = dVar29;
    do {
      uVar21 = (uint)uVar22;
      if (iVar11 <= (int)uVar18 + -1) {
        local_98 = dVar27;
        uStack_90 = uVar28;
        iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                           (pBVar16,&local_70,iVar11 + 1,(int)uVar14,4,0,0,true);
        pBVar16 = (this->breakpoints).data.
                  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar27 = local_98;
        uVar28 = uStack_90;
        dVar29 = (double)local_a8._0_8_;
      }
      iVar19 = *(int *)((long)&pBVar16->val + uVar20);
      dVar1 = local_b0[iVar19];
      if (ABS(dVar1) <= dVar27) {
        if ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + dVar29 < 0.0)
        break;
      }
      else {
        pdVar13 = local_78;
        if (dVar1 <= 0.0) {
          pdVar13 = local_80;
        }
        if ((pdVar13[iVar19] - local_b8[iVar19]) / dVar1 <= dVar29) {
          uVar22 = uVar18 & 0xffffffff;
          uVar28 = 0;
          dVar27 = ABS(dVar1);
        }
      }
      uVar21 = (uint)uVar22;
      uVar18 = uVar18 + 1;
      uVar14 = (ulong)nBp;
      uVar20 = uVar20 + 0x10;
    } while ((long)uVar18 < (long)uVar14);
  }
  pdVar4 = local_80;
  pdVar13 = local_b8;
  local_a8._0_8_ = (this->super_SPxFastRT<double>).fastDelta;
  peVar6 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar10 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableEnter;
  this_00 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_98 = dVar27;
  uStack_90 = uVar28;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar29 = peVar6->s_epsilon_multiplier;
    uVar14 = -(ulong)(dVar29 == 1.0);
    dVar29 = (double)(~uVar14 & (ulong)(dVar29 * 1e-10) | uVar14 & 0x3ddb7cdfd9d7bdbb);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    dVar29 = peVar6->s_epsilon_multiplier;
    uVar14 = -(ulong)(dVar29 == 1.0);
    local_58 = (double)(~uVar14 & (ulong)(dVar29 * 1e-10) | uVar14 & 0x3ddb7cdfd9d7bdbb);
    uStack_50 = 0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    dVar29 = local_58;
  }
  if (bVar10 == false) {
    dVar29 = (this->super_SPxFastRT<double>).minStab;
    dVar29 = (double)(-(ulong)(local_98 < 1000.0) & (ulong)dVar29 |
                     ~-(ulong)(local_98 < 1000.0) & (ulong)((local_98 * dVar29) / 1000.0));
  }
  local_a8._0_8_ = (double)local_a8._0_8_ / local_98;
  if ((int)uVar21 < 0) {
    if (-1 < baseId.super_DataKey.info) {
      uVar21 = baseId.super_DataKey.info;
      do {
        while (uVar15 = uVar21,
              iVar19 = (this->breakpoints).data.
                       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar15].idx, -1 < iVar19) {
          bVar10 = getData(this,val,&leaveIdx,iVar19,local_98,(double)local_a8._0_8_,local_b0,
                           pdVar13,pdVar4,local_78,FVEC,local_c0);
          baseId.super_DataKey.info = uVar15 - 1;
          if ((bVar10) || (uVar21 = uVar15 - 1, uVar15 == 0)) {
            baseId.super_DataKey.info = uVar15;
            if (bVar10) goto LAB_0023b7c1;
            goto LAB_0023b81e;
          }
        }
        uVar21 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  }
  else if ((dVar29 < local_98) &&
          (bVar10 = getData(this,val,&leaveIdx,
                            (this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar21].idx,local_98,
                            (double)local_a8._0_8_,local_b0,pdVar13,pdVar4,local_78,FVEC,local_c0),
          bVar10)) {
    uVar15 = baseId.super_DataKey.info;
LAB_0023b7c1:
    this->relax_count = 0;
    SPxFastRT<double>::tighten(&this->super_SPxFastRT<double>);
    if (((int)uVar15 < 1) ||
       (dVar29 = ABS((this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].val),
       pdVar13 = &(this->super_SPxFastRT<double>).fastDelta, dVar29 < *pdVar13 || dVar29 == *pdVar13
       )) {
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
      dVar29 = this->flipPotential + -0.1;
    }
    else {
      flipAndUpdate(this,(int *)&baseId);
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
           baseId.super_DataKey.info;
      if (baseId.super_DataKey.info < 10) {
        dVar29 = this->flipPotential + -0.05;
      }
      else {
        dVar29 = 1.0;
      }
    }
    this->flipPotential = dVar29;
    return leaveIdx;
  }
LAB_0023b81e:
  if (this->relax_count < 2) {
    SPxFastRT<double>::relax(&this->super_SPxFastRT<double>);
    this->relax_count = this->relax_count + 1;
    *val = local_c0;
    leaveIdx = selectLeave(this,val,(double)local_68._0_8_,false);
  }
  return leaveIdx;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}